

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLRSA.cpp
# Opt level: O3

unsigned_long __thiscall OSSLRSA::getMinKeySize(OSSLRSA *this)

{
  return 0x200;
}

Assistant:

unsigned long OSSLRSA::getMinKeySize()
{
#ifdef WITH_FIPS
	// OPENSSL_RSA_FIPS_MIN_MODULUS_BITS is 1024
	return 1024;
#else
	return 512;
#endif
}